

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generator.hpp
# Opt level: O3

void __thiscall
boost::uuids::
basic_random_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_>
::basic_random_generator
          (basic_random_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_>
           *this)

{
  undefined1 auVar1 [16];
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  *pmVar2;
  uint (*in_R8) [624];
  seed_rng local_48;
  undefined1 *local_28;
  uint local_20;
  
  pmVar2 = (mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
            *)operator_new(0x9c8);
  random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(pmVar2,&random::
                 mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>
                 ::default_seed);
  shared_ptr<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>>
  ::
  shared_ptr<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>>
            ((shared_ptr<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>>
              *)this,pmVar2);
  pmVar2 = (this->pURNG).px;
  (this->generator)._eng = pmVar2;
  (this->generator)._dist.super_uniform_int_distribution<unsigned_long>._min = 0;
  (this->generator)._dist.super_uniform_int_distribution<unsigned_long>._max = 0xffffffffffffffff;
  if (pmVar2 != (mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
                 *)0x0) {
    local_48.rd_index_ = 5;
    local_48.random_ = (FILE *)fopen("/dev/urandom","rb");
    local_48.rd_[0] = 0;
    local_48.rd_[1] = 0;
    local_48.rd_[2] = 0;
    local_48.rd_[3] = 0;
    local_48.rd_[4] = 0;
    local_28 = (undefined1 *)&local_48;
    detail::seed_rng::sha1_random_digest_(&local_48);
    local_48.rd_index_ = 1;
    local_20 = local_48.rd_[0];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pmVar2;
    random::detail::
    fill_array_int_impl<32,624ul,boost::uuids::detail::generator_iterator<boost::uuids::detail::seed_rng>,unsigned_int>
              ((detail *)&local_28,(generator_iterator<boost::uuids::detail::seed_rng> *)0x0,
               (generator_iterator<boost::uuids::detail::seed_rng>)(auVar1 << 0x40),in_R8);
    pmVar2->i = 0x270;
    random::
    mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
    ::normalize_state(pmVar2);
    if ((FILE *)local_48.random_ != (FILE *)0x0) {
      fclose((FILE *)local_48.random_);
    }
    return;
  }
  __assert_fail("px != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                ,0x2d8,
                "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<boost::random::mersenne_twister_engine<unsigned int, 32, 624, 397, 31, 2567483615, 11, 4294967295, 7, 2636928640, 15, 4022730752, 18, 1812433253>>::operator*() const [T = boost::random::mersenne_twister_engine<unsigned int, 32, 624, 397, 31, 2567483615, 11, 4294967295, 7, 2636928640, 15, 4022730752, 18, 1812433253>]"
               );
}

Assistant:

basic_random_generator()
        : pURNG(new UniformRandomNumberGenerator)
        , generator
          ( pURNG.get()
          , distribution_type
            ( (std::numeric_limits<unsigned long>::min)()
            , (std::numeric_limits<unsigned long>::max)()
            )
          )
    {
        // seed the random number generator
        detail::seed(*pURNG);
    }